

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

mi_page_t * mi_large_huge_page_alloc(mi_heap_t *heap,size_t size,size_t page_alignment)

{
  size_t size_00;
  mi_page_queue_t *pq_00;
  mi_page_t *pmVar1;
  long in_RDX;
  mi_heap_t *in_RDI;
  size_t bsize;
  mi_page_t *page;
  mi_page_queue_t *pq;
  _Bool is_huge;
  size_t block_size;
  size_t in_stack_ffffffffffffffa8;
  bool local_41;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  
  size_00 = _mi_os_good_alloc_size(in_stack_ffffffffffffffa8);
  local_41 = 0x1000000 < size_00 || in_RDX != 0;
  if (0x1000000 < size_00 || in_RDX != 0) {
    size_00 = 0x1000001;
  }
  pq_00 = mi_page_queue(in_RDI,size_00);
  pmVar1 = mi_page_fresh_alloc((mi_heap_t *)CONCAT17(local_41,in_stack_ffffffffffffffd8),pq_00,
                               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pmVar1 != (mi_page_t *)0x0) {
    mi_page_usable_block_size((mi_page_t *)0xc684dd);
    _mi_stat_increase((mi_stat_count_t *)in_RDI,size_00);
    _mi_stat_counter_increase((mi_stat_counter_t *)in_RDI,size_00);
  }
  return pmVar1;
}

Assistant:

static mi_page_t* mi_large_huge_page_alloc(mi_heap_t* heap, size_t size, size_t page_alignment) {
  size_t block_size = _mi_os_good_alloc_size(size);
  mi_assert_internal(mi_bin(block_size) == MI_BIN_HUGE || page_alignment > 0);
  bool is_huge = (block_size > MI_LARGE_OBJ_SIZE_MAX || page_alignment > 0);
  #if MI_HUGE_PAGE_ABANDON
  mi_page_queue_t* pq = (is_huge ? NULL : mi_page_queue(heap, block_size));
  #else
  mi_page_queue_t* pq = mi_page_queue(heap, is_huge ? MI_LARGE_OBJ_SIZE_MAX+1 : block_size);
  mi_assert_internal(!is_huge || mi_page_queue_is_huge(pq));
  #endif
  mi_page_t* page = mi_page_fresh_alloc(heap, pq, block_size, page_alignment);
  if (page != NULL) {
    mi_assert_internal(mi_page_immediate_available(page));

    if (is_huge) {
      mi_assert_internal(mi_page_is_huge(page));
      mi_assert_internal(_mi_page_segment(page)->kind == MI_SEGMENT_HUGE);
      mi_assert_internal(_mi_page_segment(page)->used==1);
      #if MI_HUGE_PAGE_ABANDON
      mi_assert_internal(_mi_page_segment(page)->thread_id==0); // abandoned, not in the huge queue
      mi_page_set_heap(page, NULL);
      #endif
    }
    else {
      mi_assert_internal(!mi_page_is_huge(page));
    }

    const size_t bsize = mi_page_usable_block_size(page);  // note: not `mi_page_block_size` to account for padding
    /*if (bsize <= MI_LARGE_OBJ_SIZE_MAX) {
      mi_heap_stat_increase(heap, malloc_large, bsize);
      mi_heap_stat_counter_increase(heap, malloc_large_count, 1);
    }
    else */
    {
      _mi_stat_increase(&heap->tld->stats.malloc_huge, bsize);
      _mi_stat_counter_increase(&heap->tld->stats.malloc_huge_count, 1);
    }
  }
  return page;
}